

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O2

EStatusCode __thiscall Type1Input::ParseEncoding(Type1Input *this)

{
  InputPFBDecodeStream *this_00;
  int iVar1;
  uint uVar2;
  EStatusCode EVar3;
  ulong uVar4;
  Type1Input *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inReadFrom;
  BoolAndString token;
  BoolAndString token_1;
  
  this_00 = &this->mPFBDecoder;
  InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token,this_00);
  EVar3 = eFailure;
  if (token.first == true) {
    iVar1 = std::__cxx11::string::compare((char *)&token.second);
    if (iVar1 == 0) {
      (this->mEncoding).EncodingType = eType1EncodingTypeStandardEncoding;
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token_1,this_00);
      EVar3 = -(token_1._0_4_ & 0xff ^ 1);
      std::__cxx11::string::~string((string *)&token_1.second);
    }
    else {
      (this->mEncoding).EncodingType = eType1EncodingTypeCustom;
      do {
        if (token.first != true) break;
        InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token_1,this_00);
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&token,&token_1);
        std::__cxx11::string::~string((string *)&token_1.second);
        iVar1 = std::__cxx11::string::compare((char *)&token.second);
      } while (iVar1 != 0);
      if ((token.first & 1U) != 0) {
        uVar2 = 0xffffffff;
        while( true ) {
          inReadFrom = &token.second;
          if ((((token.first & 1U) == 0) ||
              (iVar1 = std::__cxx11::string::compare((char *)inReadFrom), iVar1 == 0)) ||
             (iVar1 = std::__cxx11::string::compare((char *)inReadFrom), iVar1 == 0))
          goto LAB_001bb2dd;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token_1,this_00);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&token,(type)&token_1);
          std::__cxx11::string::~string((string *)&token_1.second);
          if (token.first == false) goto LAB_001bb2dd;
          BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_>::BoxingBaseWithRW
                    ((BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_> *)
                     &token_1,inReadFrom);
          uVar4 = (ulong)(uint)token_1._0_4_;
          if (0xff < uVar4) break;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token_1,this_00);
          this_01 = (Type1Input *)&token_1;
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&token,(type)&token_1);
          std::__cxx11::string::~string((string *)&token_1.second);
          if (token.first == false) goto LAB_001bb2dd;
          FromPSName((string *)&token_1,this_01,&token.second);
          std::__cxx11::string::operator=
                    ((string *)((this->mEncoding).mCustomEncoding + uVar4),(string *)&token_1);
          std::__cxx11::string::~string((string *)&token_1);
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token_1,this_00);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&token,(type)&token_1);
          std::__cxx11::string::~string((string *)&token_1.second);
          if (token.first == false) goto LAB_001bb2dd;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&token_1,this_00);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&token,(type)&token_1);
          std::__cxx11::string::~string((string *)&token_1.second);
        }
        uVar2 = 0;
LAB_001bb2dd:
        EVar3 = (token.first & uVar2) + eFailure;
      }
    }
  }
  std::__cxx11::string::~string((string *)&token.second);
  return EVar3;
}

Assistant:

EStatusCode Type1Input::ParseEncoding()
{
	BoolAndString token = mPFBDecoder.GetNextToken();
	EStatusCode status = eSuccess;
	int encodingIndex = 0;

	if(!token.first)
		return eFailure;

	// checking for standard encoding
	if(token.second.compare("StandardEncoding") == 0)
	{
		mEncoding.EncodingType = eType1EncodingTypeStandardEncoding;

		// skip the def
		BoolAndString token = mPFBDecoder.GetNextToken();
		if(!token.first)
			return eFailure;
		return eSuccess;
	}

	// not standard encoding, parse custom encoding
	mEncoding.EncodingType = eType1EncodingTypeCustom;

	// hop hop...skip to the first dup
	while(token.first)
	{
		token = mPFBDecoder.GetNextToken();
		if(token.second.compare("dup") == 0)
			break;
	}
	if(!token.first)
		return eFailure;

	// k. now parse the repeats of "dup index charactername put"
	// till the first occurence of "readonly" or "def".
	while(token.first)
	{
		if(token.second.compare("readonly") == 0 || token.second.compare("def") == 0)
			break;

		// get the index from the next token
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;
		encodingIndex = Int(token.second);
		if(encodingIndex < 0 || encodingIndex > 255)
		{
			status = eFailure;
			break;
		}
		
		// get the glyph name
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;
		mEncoding.mCustomEncoding[encodingIndex] = FromPSName(token.second);

		// skip the put
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;

		// get next row first token [dup or end]
		token = mPFBDecoder.GetNextToken();
	}
	if(!token.first || status != eSuccess)
		return eFailure;

	return status;
}